

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

Light * embree::ISPCScene::convertLight(Ref<embree::SceneGraph::LightNode> *in)

{
  long *in_RDI;
  Light *l;
  Ref<embree::SceneGraph::LightNode> *in_stack_00000070;
  Ref<embree::SceneGraph::LightNode> *in_stack_ffffffffffffff70;
  long *local_68 [3];
  long *local_50;
  Light *local_48;
  long **local_30;
  long **local_20;
  long **local_8;
  
  local_8 = &local_50;
  local_50 = (long *)*in_RDI;
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 0x10))();
  }
  local_48 = createLight(in_stack_ffffffffffffff70);
  local_30 = &local_50;
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 0x18))();
  }
  (**(code **)(*(long *)*in_RDI + 0x90))(0);
  updateLight(in_stack_00000070,(Light *)in);
  local_20 = local_68;
  if (local_68[0] != (long *)0x0) {
    (**(code **)(*local_68[0] + 0x18))();
  }
  return local_48;
}

Assistant:

Light* ISPCScene::convertLight(Ref<SceneGraph::LightNode> in)
  {
    Light* l = createLight(in);
    updateLight(in->get(0.0f),l);
    return l;
  }